

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL Js::TypedArrayBase::IsDetachedTypedArray(Var aValue)

{
  bool bVar1;
  undefined1 local_29;
  undefined8 local_28;
  TypedArrayBase *arr;
  Var aValue_local;
  
  bVar1 = VarIs<Js::TypedArrayBase>(aValue);
  if (bVar1) {
    local_28 = UnsafeVarTo<Js::TypedArrayBase>(aValue);
  }
  else {
    local_28 = (TypedArrayBase *)0x0;
  }
  local_29 = false;
  if (local_28 != (TypedArrayBase *)0x0) {
    local_29 = IsDetachedBuffer(local_28);
  }
  return (BOOL)local_29;
}

Assistant:

BOOL TypedArrayBase::IsDetachedTypedArray(Var aValue)
    {
        TypedArrayBase* arr = JavascriptOperators::TryFromVar<TypedArrayBase>(aValue);
        return arr && arr->IsDetachedBuffer();
    }